

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O0

void __thiscall FIX::ExeceptionStore::reset(ExeceptionStore *this,UtcTimeStamp *param_1)

{
  IOException *this_00;
  allocator<char> local_39;
  string local_38;
  UtcTimeStamp *local_18;
  UtcTimeStamp *param_1_local;
  ExeceptionStore *this_local;
  
  local_18 = param_1;
  param_1_local = (UtcTimeStamp *)this;
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"reset IOException",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

EXCEPT(IOException) { throw IOException("reset IOException"); }